

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O0

int TIFFWriteDirectoryTagSampleformatArray
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t count,double *value)

{
  int8_t iVar1;
  uint8_t uVar2;
  int16_t iVar3;
  uint16_t uVar4;
  float *value_00;
  float fVar5;
  int local_48;
  uint local_44;
  int ok;
  uint32_t i;
  void *conv;
  double *value_local;
  uint32_t count_local;
  uint16_t tag_local;
  TIFFDirEntry *dir_local;
  uint32_t *ndir_local;
  TIFF *tif_local;
  
  value_00 = (float *)_TIFFmallocExt(tif,(ulong)count << 3);
  if (value_00 == (float *)0x0) {
    TIFFErrorExtR(tif,"TIFFWriteDirectoryTagSampleformatArray","Out of memory");
    tif_local._4_4_ = 0;
  }
  else {
    uVar4 = (tif->tif_dir).td_sampleformat;
    if (uVar4 == 1) {
      if ((tif->tif_dir).td_bitspersample < 9) {
        for (local_44 = 0; local_44 < count; local_44 = local_44 + 1) {
          uVar2 = TIFFClampDoubleToUInt8(value[local_44]);
          *(uint8_t *)((long)value_00 + (ulong)local_44) = uVar2;
        }
        local_48 = TIFFWriteDirectoryTagByteArray(tif,ndir,dir,tag,count,(uint8_t *)value_00);
      }
      else if ((tif->tif_dir).td_bitspersample < 0x11) {
        for (local_44 = 0; local_44 < count; local_44 = local_44 + 1) {
          uVar4 = TIFFClampDoubleToUInt16(value[local_44]);
          *(uint16_t *)((long)value_00 + (ulong)local_44 * 2) = uVar4;
        }
        local_48 = TIFFWriteDirectoryTagShortArray(tif,ndir,dir,tag,count,(uint16_t *)value_00);
      }
      else {
        for (local_44 = 0; local_44 < count; local_44 = local_44 + 1) {
          fVar5 = (float)TIFFClampDoubleToUInt32(value[local_44]);
          value_00[local_44] = fVar5;
        }
        local_48 = TIFFWriteDirectoryTagLongArray(tif,ndir,dir,tag,count,(uint32_t *)value_00);
      }
    }
    else if (uVar4 == 2) {
      if ((tif->tif_dir).td_bitspersample < 9) {
        for (local_44 = 0; local_44 < count; local_44 = local_44 + 1) {
          iVar1 = TIFFClampDoubleToInt8(value[local_44]);
          *(int8_t *)((long)value_00 + (ulong)local_44) = iVar1;
        }
        local_48 = TIFFWriteDirectoryTagSbyteArray(tif,ndir,dir,tag,count,(int8_t *)value_00);
      }
      else if ((tif->tif_dir).td_bitspersample < 0x11) {
        for (local_44 = 0; local_44 < count; local_44 = local_44 + 1) {
          iVar3 = TIFFClampDoubleToInt16(value[local_44]);
          *(int16_t *)((long)value_00 + (ulong)local_44 * 2) = iVar3;
        }
        local_48 = TIFFWriteDirectoryTagSshortArray(tif,ndir,dir,tag,count,(int16_t *)value_00);
      }
      else {
        for (local_44 = 0; local_44 < count; local_44 = local_44 + 1) {
          fVar5 = (float)TIFFClampDoubleToInt32(value[local_44]);
          value_00[local_44] = fVar5;
        }
        local_48 = TIFFWriteDirectoryTagSlongArray(tif,ndir,dir,tag,count,(int32_t *)value_00);
      }
    }
    else if (uVar4 == 3) {
      if ((tif->tif_dir).td_bitspersample < 0x21) {
        for (local_44 = 0; local_44 < count; local_44 = local_44 + 1) {
          fVar5 = _TIFFClampDoubleToFloat(value[local_44]);
          value_00[local_44] = fVar5;
        }
        local_48 = TIFFWriteDirectoryTagFloatArray(tif,ndir,dir,tag,count,value_00);
      }
      else {
        local_48 = TIFFWriteDirectoryTagDoubleArray(tif,ndir,dir,tag,count,value);
      }
    }
    else {
      local_48 = 0;
    }
    _TIFFfreeExt(tif,value_00);
    tif_local._4_4_ = local_48;
  }
  return tif_local._4_4_;
}

Assistant:

static int TIFFWriteDirectoryTagSampleformatArray(TIFF *tif, uint32_t *ndir,
                                                  TIFFDirEntry *dir,
                                                  uint16_t tag, uint32_t count,
                                                  double *value)
{
    static const char module[] = "TIFFWriteDirectoryTagSampleformatArray";
    void *conv;
    uint32_t i;
    int ok;
    conv = _TIFFmallocExt(tif, count * sizeof(double));
    if (conv == NULL)
    {
        TIFFErrorExtR(tif, module, "Out of memory");
        return (0);
    }

    switch (tif->tif_dir.td_sampleformat)
    {
        case SAMPLEFORMAT_IEEEFP:
            if (tif->tif_dir.td_bitspersample <= 32)
            {
                for (i = 0; i < count; ++i)
                    ((float *)conv)[i] = _TIFFClampDoubleToFloat(value[i]);
                ok = TIFFWriteDirectoryTagFloatArray(tif, ndir, dir, tag, count,
                                                     (float *)conv);
            }
            else
            {
                ok = TIFFWriteDirectoryTagDoubleArray(tif, ndir, dir, tag,
                                                      count, value);
            }
            break;
        case SAMPLEFORMAT_INT:
            if (tif->tif_dir.td_bitspersample <= 8)
            {
                for (i = 0; i < count; ++i)
                    ((int8_t *)conv)[i] = TIFFClampDoubleToInt8(value[i]);
                ok = TIFFWriteDirectoryTagSbyteArray(tif, ndir, dir, tag, count,
                                                     (int8_t *)conv);
            }
            else if (tif->tif_dir.td_bitspersample <= 16)
            {
                for (i = 0; i < count; ++i)
                    ((int16_t *)conv)[i] = TIFFClampDoubleToInt16(value[i]);
                ok = TIFFWriteDirectoryTagSshortArray(tif, ndir, dir, tag,
                                                      count, (int16_t *)conv);
            }
            else
            {
                for (i = 0; i < count; ++i)
                    ((int32_t *)conv)[i] = TIFFClampDoubleToInt32(value[i]);
                ok = TIFFWriteDirectoryTagSlongArray(tif, ndir, dir, tag, count,
                                                     (int32_t *)conv);
            }
            break;
        case SAMPLEFORMAT_UINT:
            if (tif->tif_dir.td_bitspersample <= 8)
            {
                for (i = 0; i < count; ++i)
                    ((uint8_t *)conv)[i] = TIFFClampDoubleToUInt8(value[i]);
                ok = TIFFWriteDirectoryTagByteArray(tif, ndir, dir, tag, count,
                                                    (uint8_t *)conv);
            }
            else if (tif->tif_dir.td_bitspersample <= 16)
            {
                for (i = 0; i < count; ++i)
                    ((uint16_t *)conv)[i] = TIFFClampDoubleToUInt16(value[i]);
                ok = TIFFWriteDirectoryTagShortArray(tif, ndir, dir, tag, count,
                                                     (uint16_t *)conv);
            }
            else
            {
                for (i = 0; i < count; ++i)
                    ((uint32_t *)conv)[i] = TIFFClampDoubleToUInt32(value[i]);
                ok = TIFFWriteDirectoryTagLongArray(tif, ndir, dir, tag, count,
                                                    (uint32_t *)conv);
            }
            break;
        default:
            ok = 0;
    }

    _TIFFfreeExt(tif, conv);
    return (ok);
}